

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Pl_Buffer *bp;
  size_t in_R8;
  uchar ch;
  size_t bit_offset;
  size_t bits_available;
  uchar *p;
  BitWriter bw;
  BitStream b;
  
  p = (uchar *)&test()::buf;
  bit_offset = 7;
  bits_available = 0x40;
  print_values(0,7,0x40);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x5,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x4,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x6,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x9,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x9,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x2,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x1,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x0,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x19,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x4,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x3,in_R8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  p = (uchar *)&test()::buf;
  bit_offset = 7;
  bits_available = 0x40;
  print_values(0,7,0x40);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x20,in_R8);
  test_read_bits((uchar *)&p,(uchar **)&bit_offset,&bits_available,(size_t *)0x20,in_R8);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BitStream::BitStream(&b,(uchar *)&test()::buf,8);
  BitStream::getBits(&b,0x20);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  BitStream::reset(&b);
  BitStream::getBits(&b,0x20);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  BitStream::getBits(&b,0x20);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BitStream::reset(&b);
  BitStream::getBits(&b,6);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  BitStream::skipToNextByte(&b);
  BitStream::getBits(&b,8);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  BitStream::skipToNextByte(&b);
  BitStream::getBits(&b,8);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  BitStream::reset(&b);
  BitStream::getBitsSigned(&b,3);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  BitStream::getBitsSigned(&b,6);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  BitStream::getBitsSigned(&b,5);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  BitStream::getBitsSigned(&b,1);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  BitStream::getBitsSigned(&b,0x11);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  ch = '\0';
  bit_offset = 7;
  bp = (Pl_Buffer *)operator_new(0x38);
  Pl_Buffer::Pl_Buffer(bp,"buffer",(Pipeline *)0x0);
  test_write_bits(&ch,&bit_offset,0x1e,5,bp);
  test_write_bits(&ch,&bit_offset,10,4,bp);
  test_write_bits(&ch,&bit_offset,10,6,bp);
  test_write_bits(&ch,&bit_offset,0x3ebb,0,bp);
  test_write_bits(&ch,&bit_offset,0x165,9,bp);
  print_buffer(bp);
  test_write_bits(&ch,&bit_offset,0xf2,9,bp);
  test_write_bits(&ch,&bit_offset,0,2,bp);
  test_write_bits(&ch,&bit_offset,1,1,bp);
  test_write_bits(&ch,&bit_offset,0x512ea9,0x19,bp);
  test_write_bits(&ch,&bit_offset,3,3,bp);
  print_buffer(bp);
  test_write_bits(&ch,&bit_offset,0xf5156579,0x20,bp);
  test_write_bits(&ch,&bit_offset,0x1289754b,0x20,bp);
  print_buffer(bp);
  BitWriter::BitWriter(&bw,(Pipeline *)bp);
  BitWriter::writeBits(&bw,0x1e,5);
  BitWriter::flush(&bw);
  BitWriter::flush(&bw);
  BitWriter::writeBitsInt(&bw,0xab,8);
  BitWriter::flush(&bw);
  print_buffer(bp);
  BitWriter::writeBitsSigned(&bw,-1,3);
  BitWriter::writeBitsSigned(&bw,-0xc,6);
  BitWriter::writeBitsSigned(&bw,4,3);
  BitWriter::writeBitsSigned(&bw,-4,3);
  BitWriter::writeBitsSigned(&bw,-1,1);
  BitWriter::flush(&bw);
  print_buffer(bp);
  (*(bp->super_Pipeline)._vptr_Pipeline[1])(bp);
  poVar1 = std::operator<<((ostream *)&std::cout,"done");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

static void
test()
{
    // 11110101 00010101 01100101 01111001 00010010 10001001 01110101 01001011
    // F5 15 65 79 12 89 75 4B

    // Read tests

    static unsigned char const buf[] = {0xF5, 0x15, 0x65, 0x79, 0x12, 0x89, 0x75, 0x4B};

    unsigned char const* p = buf;
    size_t bit_offset = 7;
    size_t bits_available = 64;

    // 11110:101 0:001010:1 01100101: 01111001
    // 0:00:1:0010 10001001 01110101 01001:011
    print_values(p - buf, bit_offset, bits_available);
    test_read_bits(buf, p, bit_offset, bits_available, 5);
    test_read_bits(buf, p, bit_offset, bits_available, 4);
    test_read_bits(buf, p, bit_offset, bits_available, 6);
    test_read_bits(buf, p, bit_offset, bits_available, 9);
    test_read_bits(buf, p, bit_offset, bits_available, 9);
    test_read_bits(buf, p, bit_offset, bits_available, 2);
    test_read_bits(buf, p, bit_offset, bits_available, 1);
    test_read_bits(buf, p, bit_offset, bits_available, 0);
    test_read_bits(buf, p, bit_offset, bits_available, 25);

    try {
        test_read_bits(buf, p, bit_offset, bits_available, 4);
    } catch (std::exception& e) {
        std::cout << "exception: " << e.what() << std::endl;
        print_values(p - buf, bit_offset, bits_available);
    }

    test_read_bits(buf, p, bit_offset, bits_available, 3);
    std::cout << std::endl;

    // 11110101 00010101 01100101 01111001: 00010010 10001001 01110101 01001011

    p = buf;
    bit_offset = 7;
    bits_available = 64;
    print_values(p - buf, bit_offset, bits_available);
    test_read_bits(buf, p, bit_offset, bits_available, 32);
    test_read_bits(buf, p, bit_offset, bits_available, 32);
    std::cout << std::endl;

    BitStream b(buf, 8);
    std::cout << b.getBits(32) << std::endl;
    b.reset();
    std::cout << b.getBits(32) << std::endl;
    std::cout << b.getBits(32) << std::endl;
    std::cout << std::endl;

    b.reset();
    std::cout << b.getBits(6) << std::endl;
    b.skipToNextByte();
    std::cout << b.getBits(8) << std::endl;
    b.skipToNextByte();
    std::cout << b.getBits(8) << std::endl;
    std::cout << std::endl;
    b.reset();
    std::cout << b.getBitsSigned(3) << std::endl;
    std::cout << b.getBitsSigned(6) << std::endl;
    std::cout << b.getBitsSigned(5) << std::endl;
    std::cout << b.getBitsSigned(1) << std::endl;
    std::cout << b.getBitsSigned(17) << std::endl;
    std::cout << std::endl;

    // Write tests

    // 11110:101 0:001010:1 01100101: 01111001
    // 0:00:1:0010 10001001 01110101 01001:011

    unsigned char ch = 0;
    bit_offset = 7;
    auto* bp = new Pl_Buffer("buffer");

    test_write_bits(ch, bit_offset, 30UL, 5, bp);
    test_write_bits(ch, bit_offset, 10UL, 4, bp);
    test_write_bits(ch, bit_offset, 10UL, 6, bp);
    test_write_bits(ch, bit_offset, 16059UL, 0, bp);
    test_write_bits(ch, bit_offset, 357UL, 9, bp);
    print_buffer(bp);

    test_write_bits(ch, bit_offset, 242UL, 9, bp);
    test_write_bits(ch, bit_offset, 0UL, 2, bp);
    test_write_bits(ch, bit_offset, 1UL, 1, bp);
    test_write_bits(ch, bit_offset, 5320361UL, 25, bp);
    test_write_bits(ch, bit_offset, 3UL, 3, bp);

    print_buffer(bp);
    test_write_bits(ch, bit_offset, 4111820153UL, 32, bp);
    test_write_bits(ch, bit_offset, 310998347UL, 32, bp);
    print_buffer(bp);

    BitWriter bw(bp);
    bw.writeBits(30UL, 5);
    bw.flush();
    bw.flush();
    bw.writeBitsInt(0xAB, 8);
    bw.flush();
    print_buffer(bp);
    bw.writeBitsSigned(-1, 3);  // 111
    bw.writeBitsSigned(-12, 6); // 110100
    bw.writeBitsSigned(4, 3);   // 100
    bw.writeBitsSigned(-4, 3);  // 100
    bw.writeBitsSigned(-1, 1);  // 1
    bw.flush();
    print_buffer(bp);

    delete bp;
}